

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O2

void fmt::v10::detail::parse_flags<char>(format_specs<char> *specs,char **it,char *end)

{
  char cVar1;
  ushort uVar2;
  char *pcVar3;
  
  pcVar3 = *it;
  do {
    if (pcVar3 == end) {
      return;
    }
    cVar1 = *pcVar3;
    if (cVar1 == ' ') {
      if ((*(ushort *)&specs->field_0x9 & 0x70) != 0x20) {
        uVar2 = *(ushort *)&specs->field_0x9 & 0xff8f | 0x30;
        goto LAB_0016f5d4;
      }
    }
    else if (cVar1 == '#') {
      specs->field_0x9 = specs->field_0x9 | 0x80;
    }
    else {
      if (cVar1 == '+') {
        uVar2 = *(ushort *)&specs->field_0x9 & 0xff8f | 0x20;
      }
      else {
        if (cVar1 == '0') {
          (specs->fill).data_[0] = '0';
          goto LAB_0016f5d8;
        }
        if (cVar1 != '-') {
          return;
        }
        uVar2 = (*(ushort *)&specs->field_0x9 & 0xfff0) + 1;
      }
LAB_0016f5d4:
      *(ushort *)&specs->field_0x9 = uVar2;
    }
LAB_0016f5d8:
    pcVar3 = *it + 1;
    *it = pcVar3;
  } while( true );
}

Assistant:

void parse_flags(format_specs<Char>& specs, const Char*& it, const Char* end) {
  for (; it != end; ++it) {
    switch (*it) {
    case '-':
      specs.align = align::left;
      break;
    case '+':
      specs.sign = sign::plus;
      break;
    case '0':
      specs.fill[0] = '0';
      break;
    case ' ':
      if (specs.sign != sign::plus) specs.sign = sign::space;
      break;
    case '#':
      specs.alt = true;
      break;
    default:
      return;
    }
  }
}